

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

int32 it_sigrenderer_get_samples
                (sigrenderer_t *vsigrenderer,double volume,double delta,int32 size,
                sample_t_conflict **samples)

{
  int iVar1;
  long lVar2;
  int32 pos;
  int iVar3;
  long lVar4;
  double local_40;
  
  if (*(int *)((long)vsigrenderer + 0x2e2c) < 0) {
    pos = 0;
  }
  else {
    local_40 = 0.0;
    if (samples != (sample_t_conflict **)0x0) {
      local_40 = volume;
    }
    lVar4 = (long)(int)(delta * 65536.0 + 0.5);
    pos = 0;
    do {
      iVar3 = (int)(((long)*(int *)((long)vsigrenderer + 0x2e64) |
                    (long)*(int *)((long)vsigrenderer + 0x2e60) << 0x10) / lVar4);
      if (size - iVar3 == 0 || size < iVar3) {
        render((DUMB_IT_SIGRENDERER *)vsigrenderer,local_40,delta,pos,size,samples);
        lVar4 = (long)*(int *)((long)vsigrenderer + 0x2e64) - size * lVar4;
        *(int *)((long)vsigrenderer + 0x2e60) =
             *(int *)((long)vsigrenderer + 0x2e60) + (int)((ulong)lVar4 >> 0x10);
        iVar3 = pos + size;
        *(uint *)((long)vsigrenderer + 0x2e64) = (uint)lVar4 & 0xffff;
        if (samples == (sample_t_conflict **)0x0) {
          return iVar3;
        }
        dumb_remove_clicks_array
                  (*(int *)((long)vsigrenderer + 8),
                   *(DUMB_CLICK_REMOVER ***)((long)vsigrenderer + 0x2e68),samples,iVar3,
                   512.0 / delta);
        return iVar3;
      }
      render((DUMB_IT_SIGRENDERER *)vsigrenderer,local_40,delta,pos,iVar3,samples);
      pos = pos + iVar3;
      lVar2 = (long)*(int *)((long)vsigrenderer + 0x2e64) - iVar3 * lVar4;
      *(uint *)((long)vsigrenderer + 0x2e64) = (uint)lVar2 & 0xffff;
      *(int *)((long)vsigrenderer + 0x2e60) =
           *(int *)((long)vsigrenderer + 0x2e60) + (int)((ulong)lVar2 >> 0x10);
      iVar1 = process_tick((DUMB_IT_SIGRENDERER *)vsigrenderer);
      size = size - iVar3;
    } while (iVar1 == 0);
    *(undefined8 *)((long)vsigrenderer + 0x2e2c) = 0xffffffffffffffff;
  }
  return pos;
}

Assistant:

static int32 it_sigrenderer_get_samples(
	sigrenderer_t *vsigrenderer,
	double volume, double delta,
	int32 size, sample_t **samples
)
{
	DUMB_IT_SIGRENDERER *sigrenderer = vsigrenderer;
	int32 pos;
	int dt;
	int32 todo;
	LONG_LONG t;

	if (sigrenderer->order < 0) return 0; // problematic

	pos = 0;
	dt = (int)(delta * 65536.0f + 0.5f);

	/* When samples is finally used in render_playing(), it won't be used if
	 * volume is 0.
	 */
	if (!samples) volume = 0;

	for (;;) {
		todo = (long)((((LONG_LONG)sigrenderer->time_left << 16) | sigrenderer->sub_time_left) / dt);

		if (todo >= size)
			break;

		render(sigrenderer, volume, delta, pos, todo, samples);

		pos += todo;
		size -= todo;

		t = sigrenderer->sub_time_left - (LONG_LONG)todo * dt;
		sigrenderer->sub_time_left = (int32)t & 65535;
		sigrenderer->time_left += (int32)(t >> 16);

		if (process_tick(sigrenderer)) {
			sigrenderer->order = -1;
			sigrenderer->row = -1;
			return pos;
		}
	}

	render(sigrenderer, volume, delta, pos, size, samples);

	pos += size;

	t = sigrenderer->sub_time_left - (LONG_LONG)size * dt;
	sigrenderer->sub_time_left = (int32)t & 65535;
	sigrenderer->time_left += (int32)(t >> 16);

	if (samples)
		dumb_remove_clicks_array(sigrenderer->n_channels, sigrenderer->click_remover, samples, pos, 512.0f / delta);

	return pos;
}